

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ukf.cpp
# Opt level: O1

void __thiscall UKF::UpdateRadar(UKF *this,MeasurementPackage *meas_package)

{
  VectorXd *this_00;
  double *pdVar1;
  double **ppdVar2;
  double adVar3 [1];
  DenseIndex DVar4;
  double *pdVar5;
  double dVar6;
  double dVar7;
  UKF *pUVar8;
  Index index;
  DenseStorage<double,__1,__1,__1,_0> *pDVar9;
  long lVar10;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar11;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *other;
  PlainObject *pPVar12;
  undefined8 *puVar13;
  Index index_2;
  DenseStorage<double,__1,__1,__1,_0> *pDVar14;
  ulong uVar15;
  PlainObject *pPVar16;
  ulong uVar17;
  char *pcVar18;
  Index othersize;
  long lVar19;
  long lVar20;
  DenseStorage<double,__1,__1,__1,_0> *pDVar21;
  Index size;
  long lVar22;
  bool bVar23;
  double dVar24;
  double *pdVar25;
  VectorXd z_pred;
  MatrixXd Zsig;
  VectorXd z;
  VectorXd z_diff;
  MatrixXd S;
  MatrixXd K;
  VectorXd x_diff;
  MatrixXd R;
  MatrixXd Tc;
  DenseStorage<double,__1,__1,_1,_0> local_1b8;
  ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
  local_1a8;
  UKF *local_170;
  DenseStorage<double,__1,__1,__1,_0> local_168;
  DenseStorage<double,__1,__1,_1,_0> local_148;
  undefined1 local_138 [16];
  DenseStorage<double,__1,__1,__1,_0> local_128;
  DenseStorage<double,__1,__1,__1,_0> local_108;
  DenseStorage<double,__1,__1,__1,_0> local_f0;
  DenseStorage<double,__1,__1,__1,_0> local_d8;
  DenseStorage<double,__1,__1,__1,_0> local_b8;
  double local_98;
  double local_90;
  GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>
  local_88;
  plain_array<double,_1,_0,_0> local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  Scalar local_38;
  
  DVar4 = (meas_package->raw_measurements_).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_148,DVar4,DVar4,1);
  pDVar21 = (DenseStorage<double,__1,__1,__1,_0> *)
            (meas_package->raw_measurements_).
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  if ((long)pDVar21 < 0) {
LAB_00107d3d:
    pcVar18 = 
    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
    ;
    goto LAB_00107d52;
  }
  if ((DenseStorage<double,__1,__1,__1,_0> *)local_148.m_rows != pDVar21) {
    free(local_148.m_data);
    if (pDVar21 == (DenseStorage<double,__1,__1,__1,_0> *)0x0) {
      local_148.m_data = (double *)0x0;
    }
    else if (((ulong)pDVar21 >> 0x3d != 0) ||
            (local_148.m_data = (double *)malloc((long)pDVar21 * 8),
            local_148.m_data == (double *)0x0)) {
      puVar13 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar13 = operator_delete;
      __cxa_throw(puVar13,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
  }
  local_148.m_rows = (DenseIndex)pDVar21;
  if (pDVar21 !=
      (DenseStorage<double,__1,__1,__1,_0> *)
      (meas_package->raw_measurements_).
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
    pcVar18 = 
    "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::Matrix<double, -1, 1>]"
    ;
    goto LAB_00107d1c;
  }
  pDVar9 = (DenseStorage<double,__1,__1,__1,_0> *)((ulong)pDVar21 & 0x7ffffffffffffffe);
  if (1 < (long)pDVar21) {
    pDVar14 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
    do {
      pdVar25 = (meas_package->raw_measurements_).
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
                (long)pDVar14;
      dVar24 = pdVar25[1];
      local_148.m_data[(long)pDVar14] = *pdVar25;
      (local_148.m_data + (long)pDVar14)[1] = dVar24;
      pDVar14 = (DenseStorage<double,__1,__1,__1,_0> *)((long)&pDVar14->m_data + 2);
    } while (pDVar14 < pDVar9);
  }
  if ((long)pDVar9 < (long)pDVar21) {
    pdVar25 = (meas_package->raw_measurements_).
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    do {
      local_148.m_data[(long)pDVar9] = pdVar25[(long)pDVar9];
      pDVar9 = (DenseStorage<double,__1,__1,__1,_0> *)((long)&pDVar9->m_data + 1);
    } while (pDVar21 != pDVar9);
  }
  local_168.m_data = (double *)0x0;
  local_168.m_rows = 0;
  local_168.m_cols = 0;
  if (this->n_aug_ < 0) {
LAB_00107d7b:
    pcVar18 = 
    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
    ;
LAB_00107d52:
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/PlainObjectBase.h"
                  ,0xf1,pcVar18);
  }
  lVar22 = (ulong)(uint)this->n_aug_ * 2 + 1;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_168,lVar22 * 3,3,lVar22);
  if (-1 < this->n_aug_) {
    lVar22 = -1;
    do {
      lVar10 = (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_rows;
      if ((((lVar10 < 1) ||
           (lVar22 = lVar22 + 1,
           (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_cols <= lVar22)) || (lVar10 < 2)) || ((lVar10 == 2 || (lVar10 < 4)))) {
LAB_00107c93:
        __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                      "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/DenseCoeffsBase.h"
                      ,0x151,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                     );
      }
      pdVar25 = (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data;
      lVar10 = lVar10 * lVar22;
      local_170 = (UKF *)pdVar25[lVar10];
      local_90 = pdVar25[lVar10 + 1];
      local_50 = pdVar25[lVar10 + 2];
      local_98 = pdVar25[lVar10 + 3];
      local_48 = cos(local_98);
      local_58 = sin(local_98);
      local_98 = (double)local_170 * (double)local_170 + local_90 * local_90;
      if (local_98 < 0.0) {
        dVar24 = sqrt(local_98);
      }
      else {
        dVar24 = SQRT(local_98);
      }
      if ((local_168.m_rows < 1) || (local_168.m_cols <= lVar22)) goto LAB_00107c93;
      local_168.m_data[local_168.m_rows * lVar22] = dVar24;
      dVar24 = atan2(local_90,(double)local_170);
      if ((local_168.m_rows < 2) || (local_168.m_cols <= lVar22)) goto LAB_00107c93;
      local_168.m_data[local_168.m_rows * lVar22 + 1] = dVar24;
      if (local_98 < 0.0) {
        dVar24 = sqrt(local_98);
      }
      else {
        dVar24 = SQRT(local_98);
      }
      if ((local_168.m_rows < 3) || (local_168.m_cols <= lVar22)) goto LAB_00107c93;
      local_168.m_data[local_168.m_rows * lVar22 + 2] =
           ((double)local_170 * local_48 * local_50 + local_90 * local_58 * local_50) / dVar24;
    } while (SBORROW8(lVar22,(long)this->n_aug_ * 2) != lVar22 + (long)this->n_aug_ * -2 < 0);
  }
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_1b8,3,3,1);
  if (local_1b8.m_rows < 0) {
    pcVar18 = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
    ;
    goto LAB_00107e4a;
  }
  if (1 < local_1b8.m_rows) {
    uVar15 = 0;
    do {
      local_1b8.m_data[uVar15] = 0.0;
      (local_1b8.m_data + uVar15)[1] = 0.0;
      uVar15 = uVar15 + 2;
    } while (uVar15 < (local_1b8.m_rows & 0x7ffffffffffffffeU));
  }
  if ((long)(local_1b8.m_rows & 0x7ffffffffffffffeU) < local_1b8.m_rows) {
    memset((void *)((local_1b8.m_rows << 3 & 0xfffffffffffffff0U) + (long)local_1b8.m_data),0,
           (ulong)((uint)(local_1b8.m_rows << 3) & 8));
  }
  if (-1 < this->n_aug_) {
    lVar10 = 0;
    lVar22 = 0;
    do {
      if ((this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows <= lVar22) goto LAB_001079c7;
      if ((local_168.m_rows < 0) && (local_168.m_data + local_168.m_rows * lVar22 != (double *)0x0))
      goto LAB_00107cd1;
      if (local_168.m_cols <= lVar22) goto LAB_00107cb2;
      if (local_1b8.m_rows != local_168.m_rows) {
        pcVar18 = 
        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>]"
        ;
        goto LAB_00107d71;
      }
      if (local_168.m_rows < 0) goto LAB_00107d3d;
      dVar24 = (this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data[lVar22];
      local_1b8.m_rows = local_168.m_rows;
      pDVar21 = (DenseStorage<double,__1,__1,__1,_0> *)(local_168.m_rows & 0x7ffffffffffffffe);
      if (1 < local_168.m_rows) {
        pDVar9 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
        do {
          dVar6 = (local_1b8.m_data + (long)pDVar9)[1];
          pdVar25 = (double *)
                    ((long)local_168.m_data + (long)pDVar9 * 8 + local_168.m_rows * lVar10);
          dVar7 = pdVar25[1];
          local_1b8.m_data[(long)pDVar9] = *pdVar25 * dVar24 + local_1b8.m_data[(long)pDVar9];
          (local_1b8.m_data + (long)pDVar9)[1] = dVar7 * dVar24 + dVar6;
          pDVar9 = (DenseStorage<double,__1,__1,__1,_0> *)((long)&pDVar9->m_data + 2);
        } while (pDVar9 < pDVar21);
      }
      if ((long)pDVar21 < local_168.m_rows) {
        do {
          local_1b8.m_data[(long)pDVar21] =
               *(double *)((long)local_168.m_data + (long)pDVar21 * 8 + local_168.m_rows * lVar10) *
               dVar24 + local_1b8.m_data[(long)pDVar21];
          pDVar21 = (DenseStorage<double,__1,__1,__1,_0> *)((long)&pDVar21->m_data + 1);
        } while ((DenseStorage<double,__1,__1,__1,_0> *)local_168.m_rows != pDVar21);
      }
      lVar10 = lVar10 + 8;
      bVar23 = SBORROW8(lVar22,(long)this->n_aug_ * 2);
      lVar19 = lVar22 + (long)this->n_aug_ * -2;
      lVar22 = lVar22 + 1;
    } while (bVar23 != lVar19 < 0);
  }
  local_128.m_data = (double *)0x0;
  local_128.m_rows = 0;
  local_128.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)(local_138 + 0x10),9,3,3);
  local_1a8.m_lhs = (LhsNested)local_128.m_rows;
  local_1a8.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       = (double *)local_128.m_cols;
  local_1a8.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
       = 0;
  if (-1 < (local_128.m_cols | local_128.m_rows)) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    lazyAssign<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)(local_138 + 0x10),
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                *)&local_1a8);
    local_170 = this;
    if (-1 < this->n_aug_) {
      lVar10 = 0;
      lVar22 = 0;
      do {
        DVar4 = local_168.m_rows;
        pdVar25 = local_168.m_data;
        if ((local_168.m_rows < 0) &&
           (local_168.m_data + local_168.m_rows * lVar22 != (double *)0x0)) goto LAB_00107cd1;
        if (local_168.m_cols <= lVar22) goto LAB_00107cb2;
        if (local_168.m_rows != local_1b8.m_rows) goto LAB_00107d26;
        Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                  ((DenseStorage<double,__1,__1,_1,_0> *)&local_d8,local_1b8.m_rows,local_1b8.m_rows
                   ,1);
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_d8,
                   local_1b8.m_rows,1);
        if (local_d8.m_rows != local_1b8.m_rows) goto LAB_00107d07;
        pDVar21 = (DenseStorage<double,__1,__1,__1,_0> *)
                  (local_d8.m_rows - (local_d8.m_rows >> 0x3f) & 0xfffffffffffffffe);
        if (1 < local_d8.m_rows) {
          lVar19 = 0;
          do {
            pdVar1 = (double *)((long)pdVar25 + lVar19 * 8 + DVar4 * lVar10);
            dVar24 = pdVar1[1];
            dVar6 = (local_1b8.m_data + lVar19)[1];
            local_d8.m_data[lVar19] = *pdVar1 - local_1b8.m_data[lVar19];
            (local_d8.m_data + lVar19)[1] = dVar24 - dVar6;
            lVar19 = lVar19 + 2;
          } while (lVar19 < (long)pDVar21);
        }
        if ((long)pDVar21 < local_d8.m_rows) {
          do {
            local_d8.m_data[(long)pDVar21] =
                 *(double *)((long)pdVar25 + (long)pDVar21 * 8 + DVar4 * lVar10) -
                 local_1b8.m_data[(long)pDVar21];
            pDVar21 = (DenseStorage<double,__1,__1,__1,_0> *)((long)&pDVar21->m_data + 1);
          } while ((DenseStorage<double,__1,__1,__1,_0> *)local_d8.m_rows != pDVar21);
        }
        if (local_d8.m_rows < 2) goto LAB_001079c7;
        dVar24 = local_d8.m_data[1];
        while (3.141592653589793 < dVar24) {
          dVar24 = dVar24 + -6.283185307179586;
          local_d8.m_data[1] = dVar24;
          if (local_d8.m_rows < 2) goto LAB_001079c7;
        }
        dVar24 = local_d8.m_data[1];
        if (dVar24 < -3.141592653589793) {
          do {
            dVar24 = dVar24 + 6.283185307179586;
          } while (dVar24 < -3.141592653589793);
          local_d8.m_data[1] = dVar24;
        }
        if ((local_170->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_rows <= lVar22) goto LAB_001079c7;
        local_1a8.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
        m_data = (double *)
                 (local_170->weights_).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                 [lVar22];
        local_1a8.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
        m_cols = 0;
        local_1a8.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
        m_storage.m_data = (double *)0x0;
        local_1a8.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
        m_storage.m_rows = 0;
        local_1a8.m_lhs = (LhsNested)&local_d8;
        local_1a8.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
        m_rows = (DenseIndex)&local_d8;
        local_88.
        super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
        .m_lhs = (LhsNested)(local_138 + 0x10);
        local_88.
        super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
        .m_rhs = Eigen::ProductBase::operator_cast_to_Matrix_((ProductBase *)&local_1a8);
        if (((DenseStorage<double,__1,__1,__1,_0> *)local_128.m_rows !=
             *(DenseStorage<double,__1,__1,__1,_0> **)((long)local_1a8.m_lhs + 8)) ||
           ((DenseStorage<double,__1,__1,__1,_0> *)local_128.m_cols !=
            *(DenseStorage<double,__1,__1,__1,_0> **)
             (local_1a8.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_rows + 8))) goto LAB_00107cf0;
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,2>const>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)(local_138 + 0x10),
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_2>_>_>
                    *)&local_88);
        free((void *)local_1a8.m_rhs.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_cols);
        free(local_d8.m_data);
        lVar10 = lVar10 + 8;
        bVar23 = SBORROW8(lVar22,(long)local_170->n_aug_ * 2);
        lVar19 = lVar22 + (long)local_170->n_aug_ * -2;
        lVar22 = lVar22 + 1;
      } while (bVar23 != lVar19 < 0);
    }
    local_d8.m_data = (double *)0x0;
    local_d8.m_rows = 0;
    local_d8.m_cols = 0;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_d8,9,3,3);
    pUVar8 = local_170;
    local_1a8.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_data = (double *)0x0;
    local_1a8.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_rows = 1;
    local_1a8.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_cols = 1;
    *local_d8.m_data = local_170->std_radr_ * local_170->std_radr_;
    local_88.
    super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
    .m_lhs = (LhsNested)0x0;
    local_1a8.m_lhs = (LhsNested)&local_d8;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_1a8,
                         (Scalar *)&local_88);
    local_b8.m_data = (double *)0x0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,(Scalar *)&local_b8);
    local_108.m_data = (double *)0x0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,(Scalar *)&local_108);
    local_f0.m_data = (double *)(pUVar8->std_radphi_ * pUVar8->std_radphi_);
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,(Scalar *)&local_f0);
    local_138._0_8_ = (double *)0x0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,(Scalar *)local_138);
    local_60.array[0] = (double  [1])0.0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,local_60.array);
    local_38 = 0.0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,&local_38);
    local_40 = pUVar8->std_radrd_ * pUVar8->std_radrd_;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar11,&local_40)
    ;
    if (((local_1a8.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
          .m_cols + (long)local_1a8.m_rhs.
                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                          .m_data != *(DenseIndex *)((long)local_1a8.m_lhs + 8)) &&
        (*(DenseIndex *)((long)local_1a8.m_lhs + 0x10) != 0)) ||
       ((DenseStorage<double,__1,__1,__1,_0> *)
        local_1a8.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
        m_rows != *(DenseStorage<double,__1,__1,__1,_0> **)((long)local_1a8.m_lhs + 0x10))) {
      __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/CommaInitializer.h"
                    ,0x6f,
                    "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, -1>>::finished() [MatrixType = Eigen::Matrix<double, -1, -1>]"
                   );
    }
    local_1a8.m_lhs = (LhsNested)(local_138 + 0x10);
    local_1a8.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_data = (double *)&local_d8;
    if ((local_128.m_rows != local_d8.m_rows) || (local_128.m_cols != local_d8.m_cols)) {
      pcVar18 = 
      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::Matrix<double, -1, -1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, -1>, Rhs = const Eigen::Matrix<double, -1, -1>]"
      ;
      goto LAB_00107d71;
    }
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)(local_138 + 0x10),
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                *)&local_1a8);
    local_b8.m_data = (double *)0x0;
    local_b8.m_rows = 0;
    local_b8.m_cols = 0;
    lVar22 = (long)pUVar8->n_x_;
    if (lVar22 < 0) goto LAB_00107d7b;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_b8,lVar22 * 3,lVar22,3);
    local_1a8.m_lhs = (LhsNested)local_b8.m_rows;
    local_1a8.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_data = (double *)local_b8.m_cols;
    local_1a8.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_rows = 0;
    if (-1 < (local_b8.m_cols | local_b8.m_rows)) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      lazyAssign<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_b8,
                 (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)&local_1a8);
      if (-1 < pUVar8->n_aug_) {
        lVar10 = 0;
        lVar22 = 0;
        do {
          DVar4 = local_168.m_rows;
          pdVar25 = local_168.m_data;
          if ((local_168.m_rows < 0) &&
             (local_168.m_data + local_168.m_rows * lVar22 != (double *)0x0)) {
LAB_00107cd1:
            __assert_fail("(dataPtr == 0) || ( nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols))"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/MapBase.h"
                          ,0x94,
                          "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, Level = 0]"
                         );
          }
          if (local_168.m_cols <= lVar22) {
LAB_00107cb2:
            __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/Block.h"
                          ,0x76,
                          "Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
                         );
          }
          if (local_168.m_rows != local_1b8.m_rows) goto LAB_00107d26;
          Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                    ((DenseStorage<double,__1,__1,_1,_0> *)&local_108,local_1b8.m_rows,
                     local_1b8.m_rows,1);
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_108,
                     local_1b8.m_rows,1);
          if (local_108.m_rows != local_1b8.m_rows) goto LAB_00107d07;
          pDVar21 = (DenseStorage<double,__1,__1,__1,_0> *)
                    (local_108.m_rows - (local_108.m_rows >> 0x3f) & 0xfffffffffffffffe);
          if (1 < local_108.m_rows) {
            lVar19 = 0;
            do {
              pdVar1 = (double *)((long)pdVar25 + lVar19 * 8 + DVar4 * lVar10);
              dVar24 = pdVar1[1];
              dVar6 = (local_1b8.m_data + lVar19)[1];
              local_108.m_data[lVar19] = *pdVar1 - local_1b8.m_data[lVar19];
              (local_108.m_data + lVar19)[1] = dVar24 - dVar6;
              lVar19 = lVar19 + 2;
            } while (lVar19 < (long)pDVar21);
          }
          if ((long)pDVar21 < local_108.m_rows) {
            do {
              local_108.m_data[(long)pDVar21] =
                   *(double *)((long)pdVar25 + (long)pDVar21 * 8 + DVar4 * lVar10) -
                   local_1b8.m_data[(long)pDVar21];
              pDVar21 = (DenseStorage<double,__1,__1,__1,_0> *)((long)&pDVar21->m_data + 1);
            } while ((DenseStorage<double,__1,__1,__1,_0> *)local_108.m_rows != pDVar21);
          }
          if (local_108.m_rows < 2) goto LAB_001079c7;
          dVar24 = local_108.m_data[1];
          while (3.141592653589793 < dVar24) {
            dVar24 = dVar24 + -6.283185307179586;
            local_108.m_data[1] = dVar24;
            if (local_108.m_rows < 2) goto LAB_001079c7;
          }
          dVar24 = local_108.m_data[1];
          if (dVar24 < -3.141592653589793) {
            do {
              dVar24 = dVar24 + 6.283185307179586;
            } while (dVar24 < -3.141592653589793);
            local_108.m_data[1] = dVar24;
          }
          pdVar25 = (pUVar8->Xsig_pred_).
                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                    m_data;
          lVar19 = (pUVar8->Xsig_pred_).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
          ;
          if ((lVar19 < 0) && (pdVar25 + lVar19 * lVar22 != (double *)0x0)) goto LAB_00107cd1;
          if ((pUVar8->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols <= lVar22) goto LAB_00107cb2;
          lVar20 = (pUVar8->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_rows;
          if (lVar19 != lVar20) goto LAB_00107d26;
          Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                    ((DenseStorage<double,__1,__1,_1,_0> *)&local_f0,lVar20,lVar20,1);
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_f0,
                     (pUVar8->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_rows,1);
          if ((PlainObject *)local_f0.m_rows !=
              (PlainObject *)
              (pUVar8->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows) goto LAB_00107d07;
          pPVar16 = (PlainObject *)
                    (local_f0.m_rows - (local_f0.m_rows >> 0x3f) & 0xfffffffffffffffe);
          if (1 < local_f0.m_rows) {
            lVar20 = 0;
            do {
              pdVar1 = (double *)((long)pdVar25 + lVar20 * 8 + lVar19 * lVar10);
              dVar24 = pdVar1[1];
              pdVar5 = (pUVar8->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_data + lVar20;
              dVar6 = pdVar5[1];
              ppdVar2 = &(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                          local_f0.m_data)->m_storage).m_data + lVar20;
              *ppdVar2 = (double *)(*pdVar1 - *pdVar5);
              ppdVar2[1] = (double *)(dVar24 - dVar6);
              lVar20 = lVar20 + 2;
            } while (lVar20 < (long)pPVar16);
          }
          if ((long)pPVar16 < local_f0.m_rows) {
            pdVar1 = (pUVar8->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_data;
            do {
              (&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_f0.m_data)->
                m_storage).m_data)[(long)pPVar16] =
                   (double *)
                   (*(double *)((long)pdVar25 + (long)pPVar16 * 8 + lVar19 * lVar10) -
                   pdVar1[(long)pPVar16]);
              pPVar16 = (PlainObject *)
                        ((long)&(pPVar16->
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                                m_storage.m_data + 1);
            } while ((PlainObject *)local_f0.m_rows != pPVar16);
          }
          if (local_f0.m_rows < 4) goto LAB_001079c7;
          pdVar25 = (((MatrixXd *)((long)local_f0.m_data + 0x18))->
                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                    m_data;
          while (3.141592653589793 < (double)pdVar25) {
            pdVar25 = (double *)((double)pdVar25 + -6.283185307179586);
            (((MatrixXd *)((long)local_f0.m_data + 0x18))->
            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data =
                 pdVar25;
            if (local_f0.m_rows < 4) goto LAB_001079c7;
          }
          pdVar25 = (((MatrixXd *)((long)local_f0.m_data + 0x18))->
                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                    m_data;
          if ((double)pdVar25 < -3.141592653589793) {
            do {
              pdVar25 = (double *)((double)pdVar25 + 6.283185307179586);
            } while ((double)pdVar25 < -3.141592653589793);
            (((MatrixXd *)((long)local_f0.m_data + 0x18))->
            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data =
                 pdVar25;
          }
          if ((pUVar8->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows <= lVar22) goto LAB_001079c7;
          local_1a8.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
          .m_data = (double *)
                    (pUVar8->weights_).
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                    [lVar22];
          local_1a8.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
          .m_cols = 0;
          local_1a8.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_data = (double *)0x0;
          local_1a8.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_rows = 0;
          local_1a8.m_lhs = (LhsNested)&local_f0;
          local_1a8.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
          .m_rows = (DenseIndex)&local_108;
          local_88.
          super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
          .m_lhs = (LhsNested)&local_b8;
          local_88.
          super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
          .m_rhs = Eigen::ProductBase::operator_cast_to_Matrix_((ProductBase *)&local_1a8);
          if (((DenseStorage<double,__1,__1,__1,_0> *)local_b8.m_rows !=
               *(DenseStorage<double,__1,__1,__1,_0> **)((long)local_1a8.m_lhs + 8)) ||
             ((DenseStorage<double,__1,__1,__1,_0> *)local_b8.m_cols !=
              *(DenseStorage<double,__1,__1,__1,_0> **)
               (local_1a8.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_rows + 8))) goto LAB_00107cf0;
          Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
          lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,2>const>>
                    ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_b8,
                     (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_2>_>_>
                      *)&local_88);
          free((void *)local_1a8.m_rhs.
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                       m_cols);
          free(local_f0.m_data);
          free(local_108.m_data);
          lVar10 = lVar10 + 8;
          bVar23 = SBORROW8(lVar22,(long)pUVar8->n_aug_ * 2);
          lVar19 = lVar22 + (long)pUVar8->n_aug_ * -2;
          lVar22 = lVar22 + 1;
        } while (bVar23 != lVar19 < 0);
      }
      if (local_128.m_rows != local_128.m_cols) {
LAB_00107dc3:
        __assert_fail("rows() == cols()",
                      "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/LU/Inverse.h"
                      ,0x143,
                      "const internal::inverse_impl<Derived> Eigen::MatrixBase<Eigen::Matrix<double, -1, -1>>::inverse() const [Derived = Eigen::Matrix<double, -1, -1>]"
                     );
      }
      adVar3[0] = (double)((long)local_138 + 0x10);
      local_88.
      super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
      .m_lhs = (LhsNested)adVar3[0];
      Eigen::
      ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_5>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
      ::ProductBase(&local_1a8,(Matrix<double,__1,__1,_0,__1,__1> *)&local_b8,
                    (ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                     *)&local_88);
      other = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
              Eigen::ProductBase::operator_cast_to_Matrix_((ProductBase *)&local_1a8);
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
                (&local_108,*(long *)(other + 0x10) * *(long *)(other + 8),*(long *)(other + 8),
                 *(long *)(other + 0x10));
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_108,other);
      free(local_1a8.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_data);
      free(local_1a8.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_data);
      if (local_148.m_rows == local_1b8.m_rows) {
        Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                  ((DenseStorage<double,__1,__1,_1,_0> *)local_138,local_1b8.m_rows,local_1b8.m_rows
                   ,1);
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_138,
                   local_1b8.m_rows,1);
        if (local_138._8_8_ == local_1b8.m_rows) {
          pDVar21 = (DenseStorage<double,__1,__1,__1,_0> *)
                    (local_138._8_8_ - ((long)local_138._8_8_ >> 0x3f) & 0xfffffffffffffffe);
          if (1 < (long)local_138._8_8_) {
            lVar22 = 0;
            do {
              dVar24 = (local_148.m_data + lVar22)[1];
              dVar6 = (local_1b8.m_data + lVar22)[1];
              *(double *)(local_138._0_8_ + lVar22 * 8) =
                   local_148.m_data[lVar22] - local_1b8.m_data[lVar22];
              ((double *)(local_138._0_8_ + lVar22 * 8))[1] = dVar24 - dVar6;
              lVar22 = lVar22 + 2;
            } while (lVar22 < (long)pDVar21);
          }
          if ((long)pDVar21 < (long)local_138._8_8_) {
            do {
              *(double *)(local_138._0_8_ + pDVar21 * 8) =
                   local_148.m_data[(long)pDVar21] - local_1b8.m_data[(long)pDVar21];
              pDVar21 = (DenseStorage<double,__1,__1,__1,_0> *)((long)&pDVar21->m_data + 1);
            } while ((DenseStorage<double,__1,__1,__1,_0> *)local_138._8_8_ != pDVar21);
          }
          if (1 < (long)local_138._8_8_) {
            dVar24 = *(double *)(local_138._0_8_ + 8);
            do {
              if (dVar24 <= 3.141592653589793) {
                dVar24 = *(double *)(local_138._0_8_ + 8);
                if (dVar24 < -3.141592653589793) {
                  do {
                    dVar24 = dVar24 + 6.283185307179586;
                  } while (dVar24 < -3.141592653589793);
                  *(double *)(local_138._0_8_ + 8) = dVar24;
                }
                local_f0.m_data = (double *)local_138;
                if (local_128.m_rows != local_128.m_cols) goto LAB_00107dc3;
                local_60.array[0] = (double  [1])(double  [1])adVar3[0];
                Eigen::
                ProductBase<Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_4>,_Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
                ::ProductBase((ProductBase<Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_4>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                               *)&local_1a8,
                              (Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_f0,
                              (ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                               *)&local_60);
                Eigen::
                GeneralProduct<Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_4>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>
                ::GeneralProduct((GeneralProduct<Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_4>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3>
                                  *)&local_88,
                                 (GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_4>
                                  *)&local_1a8,(Matrix<double,__1,_1,_0,__1,_1> *)local_138);
                pUVar8->NIS_radar_ =
                     (double)local_88.
                             super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                             .m_lhs;
                free(local_1a8.m_result.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_data);
                free(local_1a8.m_rhs.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_data);
                local_1a8.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_rows = 0;
                local_1a8.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_cols = 0;
                local_1a8.m_lhs = (LhsNested)&local_108;
                local_1a8.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data = (double *)local_138;
                if (local_108.m_cols != local_138._8_8_) {
                  pcVar18 = 
                  "Eigen::ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>, 4>, Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>::ProductBase(const Lhs &, const Rhs &) [Derived = Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>, 4>, Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, 1>]"
                  ;
LAB_00107ee8:
                  __assert_fail("a_lhs.cols() == a_rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/ProductBase.h"
                                ,0x66,pcVar18);
                }
                pPVar12 = Eigen::ProductBase::operator_cast_to_Matrix_((ProductBase *)&local_1a8);
                if ((pUVar8->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_rows == *(DenseIndex *)((long)local_1a8.m_lhs + 8)) {
                  this_00 = &pUVar8->x_;
                  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                            (&this_00->
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                             (pPVar12->
                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                             m_storage.m_rows,1);
                  uVar15 = (pUVar8->x_).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                           m_rows;
                  if (uVar15 == (pPVar12->
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                                m_storage.m_rows) {
                    uVar17 = uVar15 - ((long)uVar15 >> 0x3f) & 0xfffffffffffffffe;
                    if (1 < (long)uVar15) {
                      lVar22 = 0;
                      do {
                        pdVar5 = (this_00->
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                                 m_storage.m_data;
                        pdVar25 = pdVar5 + lVar22;
                        dVar6 = pdVar25[1];
                        pdVar1 = (pPVar12->
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                                 m_storage.m_data + lVar22;
                        dVar24 = pdVar1[1];
                        pdVar5 = pdVar5 + lVar22;
                        *pdVar5 = *pdVar25 + *pdVar1;
                        pdVar5[1] = dVar6 + dVar24;
                        lVar22 = lVar22 + 2;
                      } while (lVar22 < (long)uVar17);
                    }
                    if ((long)uVar17 < (long)uVar15) {
                      pdVar25 = (this_00->
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                                m_storage.m_data;
                      pdVar1 = (pPVar12->
                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                               m_storage.m_data;
                      do {
                        pdVar25[uVar17] = pdVar25[uVar17] + pdVar1[uVar17];
                        uVar17 = uVar17 + 1;
                      } while (uVar15 != uVar17);
                    }
                    free((void *)local_1a8.m_rhs.
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                 m_storage.m_rows);
                    local_88.
                    super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                    .m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_data = (double *)0x0;
                    local_88.
                    super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                    .m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_rows = 0;
                    local_88.
                    super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                    .m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_cols = 0;
                    local_88.
                    super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                    .m_lhs = (LhsNested)&local_108;
                    local_88.
                    super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                    .m_rhs = (RhsNested)adVar3[0];
                    if (local_108.m_cols != local_128.m_rows) {
                      pcVar18 = 
                      "Eigen::ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>, 5>, Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>>::ProductBase(const Lhs &, const Rhs &) [Derived = Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>, 5>, Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, -1>]"
                      ;
                      goto LAB_00107ee8;
                    }
                    local_60.array[0] = (double  [1])(double  [1])&local_108;
                    Eigen::
                    ProductBase<Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5>,_Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_5>,_Eigen::GeneralProduct<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5>,_Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
                    ::ProductBase((ProductBase<Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_5>,_Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                   *)&local_1a8,&local_88,
                                  (Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_60)
                    ;
                    local_f0.m_data = (double *)&pUVar8->P_;
                    local_f0.m_rows =
                         (DenseIndex)
                         Eigen::ProductBase::operator_cast_to_Matrix_((ProductBase *)&local_1a8);
                    if (((pUVar8->P_).
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                         m_rows == *(DenseIndex *)((long)local_1a8.m_lhs + 8)) &&
                       ((pUVar8->P_).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                        m_cols == *(DenseIndex *)
                                   ((long)local_1a8.m_rhs.
                                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                          .m_storage.m_data + 8))) {
                      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
                      lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,5>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,5>const>>
                                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&pUVar8->P_
                                 ,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_5>_>_>
                                   *)&local_f0);
                      free((void *)local_1a8.m_rhs.
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                   m_storage.m_rows);
                      free(local_88.
                           super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                           .m_result.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_data);
                      free((void *)local_138._0_8_);
                      free(local_108.m_data);
                      free(local_b8.m_data);
                      free(local_d8.m_data);
                      free(local_128.m_data);
                      free(local_1b8.m_data);
                      free(local_168.m_data);
                      free(local_148.m_data);
                      return;
                    }
                    pcVar18 = 
                    "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>, 5>, Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, 5>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, -1>, Rhs = const Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>, 5>, Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, 5>]"
                    ;
                    goto LAB_00107d71;
                  }
                  pcVar18 = 
                  "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>, 4>>]"
                  ;
                  goto LAB_00107d1c;
                }
                pcVar18 = 
                "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>, 4>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>, 4>]"
                ;
                goto LAB_00107d71;
              }
              dVar24 = dVar24 + -6.283185307179586;
              *(double *)(local_138._0_8_ + 8) = dVar24;
            } while (1 < (long)local_138._8_8_);
          }
LAB_001079c7:
          __assert_fail("index >= 0 && index < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/DenseCoeffsBase.h"
                        ,0x18a,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                       );
        }
        pcVar18 = 
        "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>]"
        ;
        goto LAB_00107d1c;
      }
      pcVar18 = 
      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
      ;
      goto LAB_00107d71;
    }
  }
  local_1a8.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
       = 0;
  pcVar18 = 
  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
  ;
LAB_00107e4a:
  __assert_fail("nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/CwiseNullaryOp.h"
                ,0x3f,pcVar18);
LAB_00107d26:
  pcVar18 = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, Rhs = const Eigen::Matrix<double, -1, 1>]"
  ;
  goto LAB_00107d71;
LAB_00107d07:
  pcVar18 = 
  "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, const Eigen::Matrix<double, -1, 1>>]"
  ;
LAB_00107d1c:
  __assert_fail("rows() == other.rows() && cols() == other.cols()",
                "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/Assign.h"
                ,0x1f9,pcVar18);
LAB_00107cf0:
  pcVar18 = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Matrix<double, -1, 1>>, Eigen::Transpose<Eigen::Matrix<double, -1, 1>>, 2>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, -1>, Rhs = const Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Matrix<double, -1, 1>>, Eigen::Transpose<Eigen::Matrix<double, -1, 1>>, 2>]"
  ;
LAB_00107d71:
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/CwiseBinaryOp.h"
                ,0x84,pcVar18);
}

Assistant:

void UKF::UpdateRadar(MeasurementPackage meas_package) {
  /**
  TODO:

  Complete this function! Use radar data to update the belief about the object's
  position. Modify the state vector, x_, and covariance, P_.

  You'll also need to calculate the radar NIS.
  */

  //extract measurement as VectorXd
  VectorXd z = meas_package.raw_measurements_;

  //set measurement dimension, radar can measure r, phi, and r_dot
  int n_z = 3;

  //create matrix for sigma points in measurement space
  MatrixXd Zsig = MatrixXd(n_z, 2 * n_aug_ + 1);

  //transform sigma points into measurement space
  for (int i = 0; i < 2 * n_aug_ + 1; i++) {  //2n+1 simga points

    // extract values for better readibility
    double p_x = Xsig_pred_(0, i);
    double p_y = Xsig_pred_(1, i);
    double v   = Xsig_pred_(2, i);
    double yaw = Xsig_pred_(3, i);

    double v1 = cos(yaw)*v;
    double v2 = sin(yaw)*v;

    // measurement model
    Zsig(0, i) = sqrt(p_x*p_x + p_y*p_y);                        //r
    Zsig(1, i) = atan2(p_y, p_x);                                 //phi
    Zsig(2, i) = (p_x*v1 + p_y*v2) / sqrt(p_x*p_x + p_y*p_y);   //r_dot
  }

  //mean predicted measurement
  VectorXd z_pred = VectorXd(n_z);
  z_pred.fill(0.0);
  for (int i = 0; i < 2 * n_aug_ + 1; i++) {
    z_pred = z_pred + weights_(i) * Zsig.col(i);
  }

  //measurement covariance matrix S
  MatrixXd S = MatrixXd(n_z, n_z);
  S.fill(0.0);
  for (int i = 0; i < 2 * n_aug_ + 1; i++) {  //2n+1 simga points
    //residual
    VectorXd z_diff = Zsig.col(i) - z_pred;

    //angle normalization
    while (z_diff(1)> M_PI) z_diff(1) -= 2.*M_PI;
    while (z_diff(1)<-M_PI) z_diff(1) += 2.*M_PI;

    S = S + weights_(i) * z_diff * z_diff.transpose();
  }

  //add measurement noise covariance matrix
  MatrixXd R = MatrixXd(n_z, n_z);
  R << std_radr_*std_radr_,                       0,                     0,
                         0, std_radphi_*std_radphi_,                     0,
                         0,                       0, std_radrd_*std_radrd_;
  S = S + R;

  //create matrix for cross correlation Tc
  MatrixXd Tc = MatrixXd(n_x_, n_z);

  /*****************************************************************************
  *  UKF Update for Radar
  ****************************************************************************/
  //calculate cross correlation matrix
  Tc.fill(0.0);
  for (int i = 0; i < 2 * n_aug_ + 1; i++) {  //2n+1 simga points

    //residual
    VectorXd z_diff = Zsig.col(i) - z_pred;
    //angle normalization
    while (z_diff(1)> M_PI) z_diff(1) -= 2.*M_PI;
    while (z_diff(1)<-M_PI) z_diff(1) += 2.*M_PI;

    // state difference
    VectorXd x_diff = Xsig_pred_.col(i) - x_;
    //angle normalization
    while (x_diff(3)> M_PI) x_diff(3) -= 2.*M_PI;
    while (x_diff(3)<-M_PI) x_diff(3) += 2.*M_PI;

    Tc = Tc + weights_(i) * x_diff * z_diff.transpose();
  }

  //Kalman gain K;
  MatrixXd K = Tc * S.inverse();

  //residual
  VectorXd z_diff = z - z_pred;

  //angle normalization
  while (z_diff(1)> M_PI) z_diff(1) -= 2.*M_PI;
  while (z_diff(1)<-M_PI) z_diff(1) += 2.*M_PI;

  //calculate NIS
  NIS_radar_ = z_diff.transpose() * S.inverse() * z_diff;

  //update state mean and covariance matrix
  x_ = x_ + K * z_diff;
  P_ = P_ - K*S*K.transpose();

}